

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O3

bool is_no_ll_fpr_store(Instruction *instr,MatchParam<Register> src,MatchParam<int> offset,
                       MatchParam<Register> dest)

{
  bool bVar1;
  int32_t iVar2;
  Register local_2c;
  Register local_2a;
  MatchParam<Register> local_28;
  MatchParam<Register> local_24;
  
  if (((instr->kind == SWC1) &&
      ((local_28 = dest, local_24 = src, local_2a = InstructionAtom::get_reg(instr->src),
       ((uint)src >> 0x10 & 1) != 0 ||
       (bVar1 = Register::operator==(&local_24.value,&local_2a), bVar1)))) &&
     ((iVar2 = InstructionAtom::get_imm(instr->src + 1), ((ulong)offset >> 0x20 & 1) != 0 ||
      (iVar2 == offset.value)))) {
    local_2c = InstructionAtom::get_reg(instr->src + 2);
    if (((uint)dest >> 0x10 & 1) != 0) {
      return true;
    }
    bVar1 = Register::operator==(&local_28.value,&local_2c);
    return bVar1;
  }
  return false;
}

Assistant:

bool is_no_ll_fpr_store(const Instruction& instr,
                        MatchParam<Register> src,
                        MatchParam<int> offset,
                        MatchParam<Register> dest) {
  return instr.kind == InstructionKind::SWC1 && src == instr.src[0].get_reg() &&
         offset == instr.src[1].get_imm() && dest == instr.src[2].get_reg();
}